

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_memory.c
# Opt level: O3

ssize_t memory_write(archive *a,void *client_data,void *buff,size_t length)

{
  long lVar1;
  
  if (*(ulong *)((long)client_data + 8) < length + *client_data) {
    archive_set_error(a,0xc,"Buffer exhausted");
    length = 0xffffffffffffffe2;
  }
  else {
    memcpy((void *)(*client_data + *(long *)((long)client_data + 0x18)),buff,length);
    lVar1 = *client_data;
    *(size_t *)client_data = lVar1 + length;
    if (*(long **)((long)client_data + 0x10) != (long *)0x0) {
      **(long **)((long)client_data + 0x10) = lVar1 + length;
    }
  }
  return length;
}

Assistant:

static ssize_t
memory_write(struct archive *a, void *client_data, const void *buff, size_t length)
{
	struct write_memory_data *mine;
	mine = client_data;

	if (mine->used + length > mine->size) {
		archive_set_error(a, ENOMEM, "Buffer exhausted");
		return (ARCHIVE_FATAL);
	}
	memcpy(mine->buff + mine->used, buff, length);
	mine->used += length;
	if (mine->client_size != NULL)
		*mine->client_size = mine->used;
	return (length);
}